

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::TriangleMIntersectorKMoeller<4,_4,_false>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  Ref<embree::Geometry> *pRVar5;
  Geometry *pGVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 (*pauVar40) [16];
  byte bVar41;
  int iVar42;
  undefined4 uVar43;
  ulong uVar45;
  uint uVar46;
  long lVar47;
  long lVar48;
  ulong uVar49;
  ulong uVar50;
  undefined1 (*pauVar51) [16];
  ulong uVar52;
  long lVar53;
  ulong uVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  float fVar64;
  float fVar70;
  float fVar71;
  vint4 bi;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar72;
  vint4 ai;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  float fVar86;
  undefined1 auVar85 [16];
  vint4 bi_1;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [64];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  float fVar95;
  float fVar97;
  float fVar98;
  float fVar99;
  undefined1 auVar96 [16];
  undefined1 auVar100 [16];
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined8 local_1178;
  undefined8 uStack_1170;
  undefined8 local_1148;
  undefined8 uStack_1140;
  undefined8 local_1138;
  undefined8 uStack_1130;
  undefined1 local_1128 [4] [16];
  float local_10e8;
  float fStack_10e4;
  float fStack_10e0;
  float fStack_10dc;
  float local_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  float local_10c8;
  float fStack_10c4;
  float fStack_10c0;
  float fStack_10bc;
  undefined4 local_10b8;
  undefined4 uStack_10b4;
  undefined4 uStack_10b0;
  undefined4 uStack_10ac;
  undefined4 local_10a8;
  undefined4 uStack_10a4;
  undefined4 uStack_10a0;
  undefined4 uStack_109c;
  undefined4 local_1098;
  undefined4 uStack_1094;
  undefined4 uStack_1090;
  undefined4 uStack_108c;
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  undefined1 local_1038 [16];
  undefined1 local_1028 [16];
  undefined1 local_1018 [16];
  undefined1 local_1008 [16];
  undefined1 local_fe8 [16];
  float local_fd8 [4];
  float local_fc8 [4];
  undefined1 local_fb8 [16];
  undefined8 local_fa8;
  undefined8 uStack_fa0;
  undefined8 local_f98;
  undefined8 uStack_f90;
  undefined8 local_f88;
  undefined8 uStack_f80;
  size_t local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  vbool<4> valid;
  ulong uVar44;
  
  pauVar51 = (undefined1 (*) [16])local_f68;
  local_f78 = root.ptr;
  uStack_f70 = 0;
  uVar43 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar55._4_4_ = uVar43;
  auVar55._0_4_ = uVar43;
  auVar55._8_4_ = uVar43;
  auVar55._12_4_ = uVar43;
  uVar43 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  auVar56._4_4_ = uVar43;
  auVar56._0_4_ = uVar43;
  auVar56._8_4_ = uVar43;
  auVar56._12_4_ = uVar43;
  uVar43 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar57._4_4_ = uVar43;
  auVar57._0_4_ = uVar43;
  auVar57._8_4_ = uVar43;
  auVar57._12_4_ = uVar43;
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar45 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar49 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar50 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar42 = (tray->tfar).field_0.i[k];
  auVar89 = ZEXT1664(CONCAT412(iVar42,CONCAT48(iVar42,CONCAT44(iVar42,iVar42))));
  iVar42 = (tray->tnear).field_0.i[k];
  auVar58._4_4_ = iVar42;
  auVar58._0_4_ = iVar42;
  auVar58._8_4_ = iVar42;
  auVar58._12_4_ = iVar42;
LAB_003117a7:
  do {
    pauVar40 = pauVar51 + -1;
    pauVar51 = pauVar51 + -1;
    if (*(float *)(*pauVar40 + 8) <= *(float *)(ray + k * 4 + 0x80)) {
      uVar54 = *(ulong *)*pauVar51;
      while ((uVar54 & 8) == 0) {
        auVar60 = vsubps_avx(*(undefined1 (*) [16])(uVar54 + 0x20 + uVar45),auVar55);
        auVar59._0_4_ = fVar2 * auVar60._0_4_;
        auVar59._4_4_ = fVar2 * auVar60._4_4_;
        auVar59._8_4_ = fVar2 * auVar60._8_4_;
        auVar59._12_4_ = fVar2 * auVar60._12_4_;
        auVar60 = vsubps_avx(*(undefined1 (*) [16])(uVar54 + 0x20 + uVar49),auVar56);
        auVar65._0_4_ = auVar60._0_4_ * fVar3;
        auVar65._4_4_ = auVar60._4_4_ * fVar3;
        auVar65._8_4_ = auVar60._8_4_ * fVar3;
        auVar65._12_4_ = auVar60._12_4_ * fVar3;
        auVar60 = vpmaxsd_avx(auVar59,auVar65);
        auVar59 = vsubps_avx(*(undefined1 (*) [16])(uVar54 + 0x20 + uVar50),auVar57);
        auVar66._0_4_ = auVar59._0_4_ * fVar4;
        auVar66._4_4_ = auVar59._4_4_ * fVar4;
        auVar66._8_4_ = auVar59._8_4_ * fVar4;
        auVar66._12_4_ = auVar59._12_4_ * fVar4;
        auVar59 = vpmaxsd_avx(auVar66,auVar58);
        local_1038 = vpmaxsd_avx(auVar60,auVar59);
        auVar60 = vsubps_avx(*(undefined1 (*) [16])(uVar54 + 0x20 + (uVar45 ^ 0x10)),auVar55);
        auVar67._0_4_ = auVar60._0_4_ * fVar2;
        auVar67._4_4_ = auVar60._4_4_ * fVar2;
        auVar67._8_4_ = auVar60._8_4_ * fVar2;
        auVar67._12_4_ = auVar60._12_4_ * fVar2;
        auVar60 = vsubps_avx(*(undefined1 (*) [16])(uVar54 + 0x20 + (uVar49 ^ 0x10)),auVar56);
        auVar73._0_4_ = auVar60._0_4_ * fVar3;
        auVar73._4_4_ = auVar60._4_4_ * fVar3;
        auVar73._8_4_ = auVar60._8_4_ * fVar3;
        auVar73._12_4_ = auVar60._12_4_ * fVar3;
        auVar60 = vpminsd_avx(auVar67,auVar73);
        auVar59 = vsubps_avx(*(undefined1 (*) [16])(uVar54 + 0x20 + (uVar50 ^ 0x10)),auVar57);
        auVar74._0_4_ = auVar59._0_4_ * fVar4;
        auVar74._4_4_ = auVar59._4_4_ * fVar4;
        auVar74._8_4_ = auVar59._8_4_ * fVar4;
        auVar74._12_4_ = auVar59._12_4_ * fVar4;
        auVar59 = vpminsd_avx(auVar74,auVar89._0_16_);
        auVar60 = vpminsd_avx(auVar60,auVar59);
        auVar60 = vpcmpgtd_avx(local_1038,auVar60);
        iVar42 = vmovmskps_avx(auVar60);
        if (iVar42 == 0xf) {
          if (pauVar51 == (undefined1 (*) [16])&local_f78) {
            return;
          }
          goto LAB_003117a7;
        }
        bVar41 = (byte)iVar42 ^ 0xf;
        uVar52 = uVar54 & 0xfffffffffffffff0;
        lVar53 = 0;
        if (bVar41 != 0) {
          for (; (bVar41 >> lVar53 & 1) == 0; lVar53 = lVar53 + 1) {
          }
        }
        uVar54 = *(ulong *)(uVar52 + lVar53 * 8);
        uVar46 = bVar41 - 1 & (uint)bVar41;
        if (uVar46 != 0) {
          uVar10 = *(uint *)(local_1038 + lVar53 * 4);
          lVar53 = 0;
          if (uVar46 != 0) {
            for (; (uVar46 >> lVar53 & 1) == 0; lVar53 = lVar53 + 1) {
            }
          }
          uVar44 = *(ulong *)(uVar52 + lVar53 * 8);
          uVar11 = *(uint *)(local_1038 + lVar53 * 4);
          uVar46 = uVar46 - 1 & uVar46;
          if (uVar46 == 0) {
            if (uVar10 < uVar11) {
              *(ulong *)*pauVar51 = uVar44;
              *(uint *)(*pauVar51 + 8) = uVar11;
              pauVar51 = pauVar51 + 1;
            }
            else {
              *(ulong *)*pauVar51 = uVar54;
              *(uint *)(*pauVar51 + 8) = uVar10;
              pauVar51 = pauVar51 + 1;
              uVar54 = uVar44;
            }
          }
          else {
            auVar60._8_8_ = 0;
            auVar60._0_8_ = uVar54;
            auVar60 = vpunpcklqdq_avx(auVar60,ZEXT416(uVar10));
            auVar68._8_8_ = 0;
            auVar68._0_8_ = uVar44;
            auVar59 = vpunpcklqdq_avx(auVar68,ZEXT416(uVar11));
            lVar53 = 0;
            if (uVar46 != 0) {
              for (; (uVar46 >> lVar53 & 1) == 0; lVar53 = lVar53 + 1) {
              }
            }
            auVar75._8_8_ = 0;
            auVar75._0_8_ = *(ulong *)(uVar52 + lVar53 * 8);
            auVar66 = vpunpcklqdq_avx(auVar75,ZEXT416(*(uint *)(local_1038 + lVar53 * 4)));
            auVar65 = vpcmpgtd_avx(auVar59,auVar60);
            uVar46 = uVar46 - 1 & uVar46;
            if (uVar46 == 0) {
              auVar67 = vpshufd_avx(auVar65,0xaa);
              auVar65 = vblendvps_avx(auVar59,auVar60,auVar67);
              auVar60 = vblendvps_avx(auVar60,auVar59,auVar67);
              auVar59 = vpcmpgtd_avx(auVar66,auVar65);
              auVar67 = vpshufd_avx(auVar59,0xaa);
              auVar59 = vblendvps_avx(auVar66,auVar65,auVar67);
              auVar65 = vblendvps_avx(auVar65,auVar66,auVar67);
              auVar66 = vpcmpgtd_avx(auVar65,auVar60);
              auVar67 = vpshufd_avx(auVar66,0xaa);
              auVar66 = vblendvps_avx(auVar65,auVar60,auVar67);
              auVar60 = vblendvps_avx(auVar60,auVar65,auVar67);
              *pauVar51 = auVar60;
              pauVar51[1] = auVar66;
              uVar54 = auVar59._0_8_;
              pauVar51 = pauVar51 + 2;
            }
            else {
              lVar53 = 0;
              if (uVar46 != 0) {
                for (; (uVar46 >> lVar53 & 1) == 0; lVar53 = lVar53 + 1) {
                }
              }
              auVar84._8_8_ = 0;
              auVar84._0_8_ = *(ulong *)(uVar52 + lVar53 * 8);
              auVar73 = vpunpcklqdq_avx(auVar84,ZEXT416(*(uint *)(local_1038 + lVar53 * 4)));
              auVar67 = vpshufd_avx(auVar65,0xaa);
              auVar65 = vblendvps_avx(auVar59,auVar60,auVar67);
              auVar60 = vblendvps_avx(auVar60,auVar59,auVar67);
              auVar59 = vpcmpgtd_avx(auVar73,auVar66);
              auVar67 = vpshufd_avx(auVar59,0xaa);
              auVar59 = vblendvps_avx(auVar73,auVar66,auVar67);
              auVar66 = vblendvps_avx(auVar66,auVar73,auVar67);
              auVar67 = vpcmpgtd_avx(auVar66,auVar60);
              auVar73 = vpshufd_avx(auVar67,0xaa);
              auVar67 = vblendvps_avx(auVar66,auVar60,auVar73);
              auVar60 = vblendvps_avx(auVar60,auVar66,auVar73);
              auVar66 = vpcmpgtd_avx(auVar59,auVar65);
              auVar73 = vpshufd_avx(auVar66,0xaa);
              auVar66 = vblendvps_avx(auVar59,auVar65,auVar73);
              auVar59 = vblendvps_avx(auVar65,auVar59,auVar73);
              auVar65 = vpcmpgtd_avx(auVar67,auVar59);
              auVar73 = vpshufd_avx(auVar65,0xaa);
              auVar65 = vblendvps_avx(auVar67,auVar59,auVar73);
              auVar59 = vblendvps_avx(auVar59,auVar67,auVar73);
              *pauVar51 = auVar60;
              pauVar51[1] = auVar59;
              pauVar51[2] = auVar65;
              uVar54 = auVar66._0_8_;
              pauVar51 = pauVar51 + 3;
            }
          }
        }
      }
      uVar52 = (ulong)((uint)uVar54 & 0xf);
      if (uVar52 != 8) {
        uVar54 = uVar54 & 0xfffffffffffffff0;
        local_1098 = *(undefined4 *)(ray + k * 4);
        local_10a8 = *(undefined4 *)(ray + k * 4 + 0x10);
        local_10b8 = *(undefined4 *)(ray + k * 4 + 0x20);
        local_10c8 = *(float *)(ray + k * 4 + 0x40);
        local_10d8 = *(float *)(ray + k * 4 + 0x50);
        local_10e8 = *(float *)(ray + k * 4 + 0x60);
        lVar53 = 0;
        fStack_10e4 = local_10e8;
        fStack_10e0 = local_10e8;
        fStack_10dc = local_10e8;
        fStack_10d4 = local_10d8;
        fStack_10d0 = local_10d8;
        fStack_10cc = local_10d8;
        fStack_10c4 = local_10c8;
        fStack_10c0 = local_10c8;
        fStack_10bc = local_10c8;
        uStack_10b4 = local_10b8;
        uStack_10b0 = local_10b8;
        uStack_10ac = local_10b8;
        uStack_10a4 = local_10a8;
        uStack_10a0 = local_10a8;
        uStack_109c = local_10a8;
        uStack_1094 = local_1098;
        uStack_1090 = local_1098;
        uStack_108c = local_1098;
        do {
          lVar48 = lVar53 * 0xb0;
          pfVar1 = (float *)(uVar54 + 0x80 + lVar48);
          fVar13 = *pfVar1;
          fVar14 = pfVar1[1];
          fVar15 = pfVar1[2];
          fVar16 = pfVar1[3];
          pfVar1 = (float *)(uVar54 + 0x40 + lVar48);
          fVar17 = *pfVar1;
          fVar18 = pfVar1[1];
          fVar19 = pfVar1[2];
          fVar20 = pfVar1[3];
          auVar69._0_4_ = fVar13 * fVar17;
          auVar69._4_4_ = fVar14 * fVar18;
          auVar69._8_4_ = fVar15 * fVar19;
          auVar69._12_4_ = fVar16 * fVar20;
          pfVar1 = (float *)(uVar54 + 0x70 + lVar48);
          fVar21 = *pfVar1;
          fVar22 = pfVar1[1];
          fVar23 = pfVar1[2];
          fVar24 = pfVar1[3];
          pfVar1 = (float *)(uVar54 + 0x50 + lVar48);
          fVar25 = *pfVar1;
          fVar26 = pfVar1[1];
          fVar27 = pfVar1[2];
          fVar28 = pfVar1[3];
          auVar76._0_4_ = fVar21 * fVar25;
          auVar76._4_4_ = fVar22 * fVar26;
          auVar76._8_4_ = fVar23 * fVar27;
          auVar76._12_4_ = fVar24 * fVar28;
          auVar65 = vsubps_avx(auVar76,auVar69);
          pfVar1 = (float *)(uVar54 + 0x60 + lVar48);
          fVar29 = *pfVar1;
          fVar30 = pfVar1[1];
          fVar31 = pfVar1[2];
          fVar32 = pfVar1[3];
          auVar100._0_4_ = fVar25 * fVar29;
          auVar100._4_4_ = fVar26 * fVar30;
          auVar100._8_4_ = fVar27 * fVar31;
          auVar100._12_4_ = fVar28 * fVar32;
          auVar39._4_4_ = uStack_1094;
          auVar39._0_4_ = local_1098;
          auVar39._8_4_ = uStack_1090;
          auVar39._12_4_ = uStack_108c;
          auVar60 = vsubps_avx(*(undefined1 (*) [16])(uVar54 + lVar48),auVar39);
          auVar38._4_4_ = uStack_10a4;
          auVar38._0_4_ = local_10a8;
          auVar38._8_4_ = uStack_10a0;
          auVar38._12_4_ = uStack_109c;
          auVar59 = vsubps_avx(*(undefined1 (*) [16])(uVar54 + 0x10 + lVar48),auVar38);
          auVar37._4_4_ = uStack_10b4;
          auVar37._0_4_ = local_10b8;
          auVar37._8_4_ = uStack_10b0;
          auVar37._12_4_ = uStack_10ac;
          auVar66 = vsubps_avx(*(undefined1 (*) [16])(uVar54 + 0x20 + lVar48),auVar37);
          pfVar1 = (float *)(uVar54 + 0x30 + lVar48);
          fVar33 = *pfVar1;
          fVar34 = pfVar1[1];
          fVar35 = pfVar1[2];
          fVar36 = pfVar1[3];
          auVar90._0_4_ = fVar13 * fVar33;
          auVar90._4_4_ = fVar14 * fVar34;
          auVar90._8_4_ = fVar15 * fVar35;
          auVar90._12_4_ = fVar16 * fVar36;
          auVar67 = vsubps_avx(auVar90,auVar100);
          auVar77._0_4_ = fVar21 * fVar33;
          auVar77._4_4_ = fVar22 * fVar34;
          auVar77._8_4_ = fVar23 * fVar35;
          auVar77._12_4_ = fVar24 * fVar36;
          auVar91._0_4_ = fVar29 * fVar17;
          auVar91._4_4_ = fVar30 * fVar18;
          auVar91._8_4_ = fVar31 * fVar19;
          auVar91._12_4_ = fVar32 * fVar20;
          auVar73 = vsubps_avx(auVar91,auVar77);
          fVar64 = auVar66._0_4_;
          auVar61._0_4_ = local_10d8 * fVar64;
          fVar71 = auVar66._4_4_;
          auVar61._4_4_ = fStack_10d4 * fVar71;
          fVar86 = auVar66._8_4_;
          auVar61._8_4_ = fStack_10d0 * fVar86;
          fVar8 = auVar66._12_4_;
          auVar61._12_4_ = fStack_10cc * fVar8;
          fVar70 = auVar59._0_4_;
          auVar92._0_4_ = local_10e8 * fVar70;
          fVar72 = auVar59._4_4_;
          auVar92._4_4_ = fStack_10e4 * fVar72;
          fVar7 = auVar59._8_4_;
          auVar92._8_4_ = fStack_10e0 * fVar7;
          fVar9 = auVar59._12_4_;
          auVar92._12_4_ = fStack_10dc * fVar9;
          auVar59 = vsubps_avx(auVar92,auVar61);
          fVar95 = auVar60._0_4_;
          auVar93._0_4_ = fVar95 * local_10e8;
          fVar97 = auVar60._4_4_;
          auVar93._4_4_ = fVar97 * fStack_10e4;
          fVar98 = auVar60._8_4_;
          auVar93._8_4_ = fVar98 * fStack_10e0;
          fVar99 = auVar60._12_4_;
          auVar93._12_4_ = fVar99 * fStack_10dc;
          auVar82._0_4_ = fVar64 * local_10c8;
          auVar82._4_4_ = fVar71 * fStack_10c4;
          auVar82._8_4_ = fVar86 * fStack_10c0;
          auVar82._12_4_ = fVar8 * fStack_10bc;
          auVar66 = vsubps_avx(auVar82,auVar93);
          auVar94._0_4_ = fVar70 * local_10c8;
          auVar94._4_4_ = fVar72 * fStack_10c4;
          auVar94._8_4_ = fVar7 * fStack_10c0;
          auVar94._12_4_ = fVar9 * fStack_10bc;
          auVar96._0_4_ = local_10d8 * fVar95;
          auVar96._4_4_ = fStack_10d4 * fVar97;
          auVar96._8_4_ = fStack_10d0 * fVar98;
          auVar96._12_4_ = fStack_10cc * fVar99;
          auVar74 = vsubps_avx(auVar96,auVar94);
          local_1178._0_4_ = auVar65._0_4_;
          local_1178._4_4_ = auVar65._4_4_;
          uStack_1170._0_4_ = auVar65._8_4_;
          uStack_1170._4_4_ = auVar65._12_4_;
          auVar87._0_4_ =
               local_10c8 * (float)local_1178 +
               auVar67._0_4_ * local_10d8 + auVar73._0_4_ * local_10e8;
          auVar87._4_4_ =
               fStack_10c4 * local_1178._4_4_ +
               auVar67._4_4_ * fStack_10d4 + auVar73._4_4_ * fStack_10e4;
          auVar87._8_4_ =
               fStack_10c0 * (float)uStack_1170 +
               auVar67._8_4_ * fStack_10d0 + auVar73._8_4_ * fStack_10e0;
          auVar87._12_4_ =
               fStack_10bc * uStack_1170._4_4_ +
               auVar67._12_4_ * fStack_10cc + auVar73._12_4_ * fStack_10dc;
          local_1088 = auVar59._0_4_;
          fStack_1084 = auVar59._4_4_;
          fStack_1080 = auVar59._8_4_;
          fStack_107c = auVar59._12_4_;
          auVar62._8_4_ = 0x80000000;
          auVar62._0_8_ = 0x8000000080000000;
          auVar62._12_4_ = 0x80000000;
          auVar60 = vandps_avx(auVar87,auVar62);
          uVar46 = auVar60._0_4_;
          local_1038._0_4_ =
               (float)((uint)(local_1088 * fVar29 + auVar74._0_4_ * fVar13 + auVar66._0_4_ * fVar21)
                      ^ uVar46);
          uVar10 = auVar60._4_4_;
          local_1038._4_4_ =
               (float)((uint)(fStack_1084 * fVar30 + auVar74._4_4_ * fVar14 + auVar66._4_4_ * fVar22
                             ) ^ uVar10);
          uVar11 = auVar60._8_4_;
          local_1038._8_4_ =
               (float)((uint)(fStack_1080 * fVar31 + auVar74._8_4_ * fVar15 + auVar66._8_4_ * fVar23
                             ) ^ uVar11);
          uVar12 = auVar60._12_4_;
          local_1038._12_4_ =
               (float)((uint)(fStack_107c * fVar32 +
                             auVar74._12_4_ * fVar16 + auVar66._12_4_ * fVar24) ^ uVar12);
          local_1028._0_4_ =
               (float)((uint)(local_1088 * fVar33 + auVar66._0_4_ * fVar17 + auVar74._0_4_ * fVar25)
                      ^ uVar46);
          local_1028._4_4_ =
               (float)((uint)(fStack_1084 * fVar34 + auVar66._4_4_ * fVar18 + auVar74._4_4_ * fVar26
                             ) ^ uVar10);
          local_1028._8_4_ =
               (float)((uint)(fStack_1080 * fVar35 + auVar66._8_4_ * fVar19 + auVar74._8_4_ * fVar27
                             ) ^ uVar11);
          local_1028._12_4_ =
               (float)((uint)(fStack_107c * fVar36 +
                             auVar66._12_4_ * fVar20 + auVar74._12_4_ * fVar28) ^ uVar12);
          auVar66 = ZEXT816(0) << 0x20;
          auVar60 = vcmpps_avx(local_1038,auVar66,5);
          auVar59 = vcmpps_avx(local_1028,auVar66,5);
          auVar60 = vandps_avx(auVar60,auVar59);
          auVar78._8_4_ = 0x7fffffff;
          auVar78._0_8_ = 0x7fffffff7fffffff;
          auVar78._12_4_ = 0x7fffffff;
          local_1008 = vandps_avx(auVar87,auVar78);
          auVar59 = vcmpps_avx(auVar87,auVar66,4);
          auVar60 = vandps_avx(auVar60,auVar59);
          auVar79._0_4_ = local_1038._0_4_ + local_1028._0_4_;
          auVar79._4_4_ = local_1038._4_4_ + local_1028._4_4_;
          auVar79._8_4_ = local_1038._8_4_ + local_1028._8_4_;
          auVar79._12_4_ = local_1038._12_4_ + local_1028._12_4_;
          auVar59 = vcmpps_avx(auVar79,local_1008,2);
          auVar66 = auVar59 & auVar60;
          if ((((auVar66 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar66 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar66 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar66[0xf] < '\0') {
            auVar60 = vandps_avx(auVar60,auVar59);
            local_1018._0_4_ =
                 (float)((uint)(fVar95 * (float)local_1178 +
                               fVar70 * auVar67._0_4_ + fVar64 * auVar73._0_4_) ^ uVar46);
            local_1018._4_4_ =
                 (float)((uint)(fVar97 * local_1178._4_4_ +
                               fVar72 * auVar67._4_4_ + fVar71 * auVar73._4_4_) ^ uVar10);
            local_1018._8_4_ =
                 (float)((uint)(fVar98 * (float)uStack_1170 +
                               fVar7 * auVar67._8_4_ + fVar86 * auVar73._8_4_) ^ uVar11);
            local_1018._12_4_ =
                 (float)((uint)(fVar99 * uStack_1170._4_4_ +
                               fVar9 * auVar67._12_4_ + fVar8 * auVar73._12_4_) ^ uVar12);
            fVar64 = *(float *)(ray + k * 4 + 0x30);
            fVar70 = local_1008._0_4_;
            auVar80._0_4_ = fVar70 * fVar64;
            fVar71 = local_1008._4_4_;
            auVar80._4_4_ = fVar71 * fVar64;
            fVar72 = local_1008._8_4_;
            auVar80._8_4_ = fVar72 * fVar64;
            fVar86 = local_1008._12_4_;
            auVar80._12_4_ = fVar86 * fVar64;
            auVar59 = vcmpps_avx(auVar80,local_1018,1);
            fVar64 = *(float *)(ray + k * 4 + 0x80);
            auVar83._0_4_ = fVar70 * fVar64;
            auVar83._4_4_ = fVar71 * fVar64;
            auVar83._8_4_ = fVar72 * fVar64;
            auVar83._12_4_ = fVar86 * fVar64;
            auVar66 = vcmpps_avx(local_1018,auVar83,2);
            auVar59 = vandps_avx(auVar59,auVar66);
            auVar66 = auVar60 & auVar59;
            if ((((auVar66 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar66 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar66 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar66[0xf] < '\0') {
              local_1128[0] = vandps_avx(auVar59,auVar60);
              local_fe8 = local_1128[0];
              local_1178 = auVar65._0_8_;
              uStack_1170 = auVar65._8_8_;
              local_fa8 = local_1178;
              uStack_fa0 = uStack_1170;
              local_1138 = auVar67._0_8_;
              uStack_1130 = auVar67._8_8_;
              local_f98 = local_1138;
              uStack_f90 = uStack_1130;
              local_1148 = auVar73._0_8_;
              uStack_1140 = auVar73._8_8_;
              local_f88 = local_1148;
              uStack_f80 = uStack_1140;
              auVar60 = vrcpps_avx(local_1008);
              fVar64 = auVar60._0_4_;
              auVar81._0_4_ = fVar70 * fVar64;
              fVar70 = auVar60._4_4_;
              auVar81._4_4_ = fVar71 * fVar70;
              fVar71 = auVar60._8_4_;
              auVar81._8_4_ = fVar72 * fVar71;
              fVar72 = auVar60._12_4_;
              auVar81._12_4_ = fVar86 * fVar72;
              auVar85._8_4_ = 0x3f800000;
              auVar85._0_8_ = 0x3f8000003f800000;
              auVar85._12_4_ = 0x3f800000;
              auVar60 = vsubps_avx(auVar85,auVar81);
              fVar64 = fVar64 + fVar64 * auVar60._0_4_;
              fVar70 = fVar70 + fVar70 * auVar60._4_4_;
              fVar71 = fVar71 + fVar71 * auVar60._8_4_;
              fVar72 = fVar72 + fVar72 * auVar60._12_4_;
              auVar63._0_4_ = fVar64 * local_1018._0_4_;
              auVar63._4_4_ = fVar70 * local_1018._4_4_;
              auVar63._8_4_ = fVar71 * local_1018._8_4_;
              auVar63._12_4_ = fVar72 * local_1018._12_4_;
              local_fb8 = auVar63;
              local_fd8[0] = fVar64 * local_1038._0_4_;
              local_fd8[1] = fVar70 * local_1038._4_4_;
              local_fd8[2] = fVar71 * local_1038._8_4_;
              local_fd8[3] = fVar72 * local_1038._12_4_;
              auVar88._8_4_ = 0x7f800000;
              auVar88._0_8_ = 0x7f8000007f800000;
              auVar88._12_4_ = 0x7f800000;
              auVar60 = vblendvps_avx(auVar88,auVar63,local_1128[0]);
              local_fc8[0] = fVar64 * local_1028._0_4_;
              local_fc8[1] = fVar70 * local_1028._4_4_;
              local_fc8[2] = fVar71 * local_1028._8_4_;
              local_fc8[3] = fVar72 * local_1028._12_4_;
              auVar59 = vshufps_avx(auVar60,auVar60,0xb1);
              auVar59 = vminps_avx(auVar59,auVar60);
              auVar65 = vshufpd_avx(auVar59,auVar59,1);
              auVar59 = vminps_avx(auVar65,auVar59);
              auVar60 = vcmpps_avx(auVar60,auVar59,0);
              auVar65 = local_1128[0] & auVar60;
              auVar59 = vpcmpeqd_avx(auVar59,auVar59);
              if ((((auVar65 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar65 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar65 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar65[0xf] < '\0') {
                auVar59 = auVar60;
              }
              lVar48 = lVar48 + uVar54;
              auVar60 = vandps_avx(local_1128[0],auVar59);
              uVar43 = vmovmskps_avx(auVar60);
              uVar44 = CONCAT44((int)((ulong)context >> 0x20),uVar43);
              lVar47 = 0;
              if (uVar44 != 0) {
                for (; (uVar44 >> lVar47 & 1) == 0; lVar47 = lVar47 + 1) {
                }
              }
              pRVar5 = (context->scene->geometries).items;
              uVar46 = *(uint *)(ray + k * 4 + 0x90);
              uVar10 = *(uint *)(lVar48 + 0x90 + lVar47 * 4);
              while (pGVar6 = pRVar5[uVar10].ptr, (pGVar6->mask & uVar46) == 0) {
                *(undefined4 *)(local_1128[0] + lVar47 * 4) = 0;
                if ((((local_1128[0] >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (local_1128[0] >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (local_1128[0] >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < local_1128[0][0xf]) goto LAB_00311caf;
                auVar60 = vblendvps_avx(auVar88,auVar63,local_1128[0]);
                auVar59 = vshufps_avx(auVar60,auVar60,0xb1);
                auVar59 = vminps_avx(auVar59,auVar60);
                auVar65 = vshufpd_avx(auVar59,auVar59,1);
                auVar59 = vminps_avx(auVar65,auVar59);
                auVar59 = vcmpps_avx(auVar60,auVar59,0);
                auVar65 = local_1128[0] & auVar59;
                auVar60 = local_1128[0];
                if ((((auVar65 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar65 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar65 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar65[0xf] < '\0') {
                  auVar60 = vandps_avx(auVar59,local_1128[0]);
                }
                uVar43 = vmovmskps_avx(auVar60);
                uVar44 = CONCAT44((int)((ulong)pGVar6 >> 0x20),uVar43);
                lVar47 = 0;
                if (uVar44 != 0) {
                  for (; (uVar44 >> lVar47 & 1) == 0; lVar47 = lVar47 + 1) {
                  }
                }
                uVar10 = *(uint *)(lVar48 + 0x90 + lVar47 * 4);
              }
              fVar64 = local_fd8[lVar47];
              fVar70 = local_fc8[lVar47];
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_fb8 + lVar47 * 4);
              *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)((long)&local_fa8 + lVar47 * 4);
              *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)((long)&local_f98 + lVar47 * 4);
              *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)((long)&local_f88 + lVar47 * 4);
              *(float *)(ray + k * 4 + 0xf0) = fVar64;
              *(float *)(ray + k * 4 + 0x100) = fVar70;
              *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)(lVar48 + 0xa0 + lVar47 * 4);
              *(uint *)(ray + k * 4 + 0x120) = uVar10;
              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
            }
          }
LAB_00311caf:
          lVar53 = lVar53 + 1;
        } while (lVar53 != uVar52 - 8);
      }
      uVar43 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar89 = ZEXT1664(CONCAT412(uVar43,CONCAT48(uVar43,CONCAT44(uVar43,uVar43))));
    }
    if (pauVar51 == (undefined1 (*) [16])&local_f78) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }